

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O2

bool wipe_doBurn(int ticks)

{
  byte bVar1;
  long lVar2;
  BYTE *pBVar3;
  int iVar4;
  BYTE *pBVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  DFrameBuffer *pDVar10;
  BYTE *pBVar11;
  short *psVar12;
  short *psVar13;
  long lVar14;
  int iVar15;
  
  burntime = burntime + ticks;
  uVar9 = 0;
  for (iVar6 = ticks * -2; (pBVar3 = burnarray, uVar9 == 0 && (iVar6 != 0)); iVar6 = iVar6 + 1) {
    density = wipe_CalcBurn(burnarray,0x40,0x40,density);
    uVar9 = (uint)density >> 0x1f;
  }
  iVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  iVar15 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
  lVar2 = (long)iVar15;
  pBVar5 = (screen->super_DSimpleCanvas).super_DCanvas.Buffer;
  iVar4 = 0;
  pDVar10 = screen;
  psVar12 = wipe_scr_start;
  psVar13 = wipe_scr_end;
  for (iVar7 = 0; iVar7 < iVar15; iVar7 = iVar7 + 1) {
    iVar15 = 0;
    for (lVar14 = 0; lVar8 = (long)(pDVar10->super_DSimpleCanvas).super_DCanvas.Width,
        lVar14 < lVar8; lVar14 = lVar14 + 1) {
      bVar1 = pBVar3[(int)((iVar15 >> 0x10) + (iVar4 >> 10 & 0xffffffc0U))];
      if (bVar1 < 0x7e) {
        if (bVar1 < 2) {
          pBVar11 = (BYTE *)((long)psVar12 + lVar14);
        }
        else {
          uVar9 = Col2RGB8[(byte)(0x40 - (bVar1 >> 1))][*(byte *)((long)psVar12 + lVar14)] +
                  Col2RGB8[bVar1 >> 1][*(byte *)((long)psVar13 + lVar14)] | 0x1f07c1f;
          pBVar11 = RGB32k.All + (uVar9 >> 0xf & uVar9);
        }
        uVar9 = 0;
      }
      else {
        pBVar11 = (BYTE *)((long)psVar13 + lVar14);
      }
      pBVar5[lVar14] = *pBVar11;
      iVar15 = iVar15 + (int)(0x400000 / (long)iVar6);
      pDVar10 = screen;
    }
    psVar12 = (short *)((long)psVar12 + lVar8);
    psVar13 = (short *)((long)psVar13 + lVar8);
    pBVar5 = pBVar5 + (pDVar10->super_DSimpleCanvas).super_DCanvas.Pitch;
    iVar4 = iVar4 + (int)(0x400000 / lVar2);
    iVar15 = (pDVar10->super_DSimpleCanvas).super_DCanvas.Height;
  }
  return (bool)((byte)uVar9 | 0x28 < burntime);
}

Assistant:

bool wipe_doBurn (int ticks)
{
	bool done;

	burntime += ticks;
	ticks *= 2;

	// Make the fire burn
	done = false;
	while (!done && ticks--)
	{
		density = wipe_CalcBurn(burnarray, FIREWIDTH, FIREHEIGHT, density);
		done = (density < 0);
	}

	// Draw the screen
	int xstep, ystep, firex, firey;
	int x, y;
	BYTE *to, *fromold, *fromnew;
	const int SHIFT = 16;

	xstep = (FIREWIDTH << SHIFT) / SCREENWIDTH;
	ystep = (FIREHEIGHT << SHIFT) / SCREENHEIGHT;
	to = screen->GetBuffer();
	fromold = (BYTE *)wipe_scr_start;
	fromnew = (BYTE *)wipe_scr_end;

	for (y = 0, firey = 0; y < SCREENHEIGHT; y++, firey += ystep)
	{
		for (x = 0, firex = 0; x < SCREENWIDTH; x++, firex += xstep)
		{
			int fglevel;

			fglevel = burnarray[(firex>>SHIFT)+(firey>>SHIFT)*FIREWIDTH] / 2;
			if (fglevel >= 63)
			{
				to[x] = fromnew[x];
			}
			else if (fglevel == 0)
			{
				to[x] = fromold[x];
				done = false;
			}
			else
			{
				int bglevel = 64-fglevel;
				DWORD *fg2rgb = Col2RGB8[fglevel];
				DWORD *bg2rgb = Col2RGB8[bglevel];
				DWORD fg = fg2rgb[fromnew[x]];
				DWORD bg = bg2rgb[fromold[x]];
				fg = (fg+bg) | 0x1f07c1f;
				to[x] = RGB32k.All[fg & (fg>>15)];
				done = false;
			}
		}
		fromold += SCREENWIDTH;
		fromnew += SCREENWIDTH;
		to += SCREENPITCH;
	}

	return done || (burntime > 40);
}